

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall wallet::WalletBatch::EraseWatchOnly(WalletBatch *this,CScript *dest)

{
  bool bVar1;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CScript>
  *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  WalletBatch *in_stack_ffffffffffffff30;
  WalletBatch *this_00;
  bool local_89;
  WalletBatch local_88 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_pair<std::__cxx11::string_const&,CScript_const&>
            (in_stack_ffffffffffffff20,(CScript *)in_stack_ffffffffffffff18);
  bVar1 = EraseIC<std::pair<std::__cxx11::string,CScript>>
                    (in_stack_ffffffffffffff30,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CScript>
                      *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CScript>::
  ~pair(in_stack_ffffffffffffff18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_00 = local_88;
    std::make_pair<std::__cxx11::string_const&,CScript_const&>
              (in_stack_ffffffffffffff20,(CScript *)in_stack_ffffffffffffff18);
    local_89 = EraseIC<std::pair<std::__cxx11::string,CScript>>
                         (this_00,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CScript>
                                   *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CScript>::
    ~pair(in_stack_ffffffffffffff18);
  }
  else {
    local_89 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_89;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::EraseWatchOnly(const CScript &dest)
{
    if (!EraseIC(std::make_pair(DBKeys::WATCHMETA, dest))) {
        return false;
    }
    return EraseIC(std::make_pair(DBKeys::WATCHS, dest));
}